

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O0

void __thiscall
sglr::rc::ObjectManager<sglr::rc::Renderbuffer>::getAll
          (ObjectManager<sglr::rc::Renderbuffer> *this,
          vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_> *objects)

{
  Renderbuffer *pRVar1;
  bool bVar2;
  size_type __new_size;
  pointer ppVar3;
  reference ppRVar4;
  __normal_iterator<sglr::rc::Renderbuffer_**,_std::vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>_>
  local_38;
  _Self local_30;
  _Self local_28;
  const_iterator i;
  iterator dst;
  vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_> *objects_local;
  ObjectManager<sglr::rc::Renderbuffer> *this_local;
  
  __new_size = std::
               map<unsigned_int,_sglr::rc::Renderbuffer_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::Renderbuffer_*>_>_>
               ::size(&this->m_objects);
  std::vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>::resize
            (objects,__new_size);
  i._M_node = (_Base_ptr)
              std::vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>::
              begin(objects);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_sglr::rc::Renderbuffer_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::Renderbuffer_*>_>_>
       ::begin(&this->m_objects);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_sglr::rc::Renderbuffer_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::Renderbuffer_*>_>_>
         ::end(&this->m_objects);
    bVar2 = std::operator!=(&local_28,&local_30);
    if (!bVar2) break;
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_sglr::rc::Renderbuffer_*>_>
             ::operator->(&local_28);
    pRVar1 = ppVar3->second;
    local_38 = __gnu_cxx::
               __normal_iterator<sglr::rc::Renderbuffer_**,_std::vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>_>
               ::operator++((__normal_iterator<sglr::rc::Renderbuffer_**,_std::vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>_>
                             *)&i,0);
    ppRVar4 = __gnu_cxx::
              __normal_iterator<sglr::rc::Renderbuffer_**,_std::vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>_>
              ::operator*(&local_38);
    *ppRVar4 = pRVar1;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_sglr::rc::Renderbuffer_*>_>::
    operator++(&local_28,0);
  }
  return;
}

Assistant:

void ObjectManager<T>::getAll (typename std::vector<T*>& objects) const
{
	objects.resize(m_objects.size());
	typename std::vector<T*>::iterator dst = objects.begin();

	for (typename std::map<deUint32, T*>::const_iterator i = m_objects.begin();
		 i != m_objects.end(); i++)
	{
		*dst++ = i->second;
	}
}